

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t driver::zesFirmwareSetSecurityVersionExp(zes_firmware_handle_t hFirmware)

{
  zes_pfnFirmwareSetSecurityVersionExp_t pfnSetSecurityVersionExp;
  ze_result_t result;
  zes_firmware_handle_t hFirmware_local;
  
  pfnSetSecurityVersionExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011ccf0 != (code *)0x0) {
    pfnSetSecurityVersionExp._4_4_ = (*DAT_0011ccf0)(hFirmware);
  }
  return pfnSetSecurityVersionExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesFirmwareSetSecurityVersionExp(
        zes_firmware_handle_t hFirmware                 ///< [in] Handle for the component.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnSetSecurityVersionExp = context.zesDdiTable.FirmwareExp.pfnSetSecurityVersionExp;
        if( nullptr != pfnSetSecurityVersionExp )
        {
            result = pfnSetSecurityVersionExp( hFirmware );
        }
        else
        {
            // generic implementation
        }

        return result;
    }